

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_dist.hpp
# Opt level: O2

int __thiscall trng::discrete_dist::operator()(discrete_dist *this,lcg64 *r)

{
  double dVar1;
  double *pdVar2;
  ulong uVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  if ((this->P).N_ == 0) {
    return -1;
  }
  dVar7 = utility::u01xx_traits<double,_1UL,_trng::lcg64>::co(r);
  pdVar2 = (this->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (this->P).offset_;
  uVar6 = 0;
  dVar7 = dVar7 * *pdVar2;
  while (uVar6 < uVar3) {
    dVar1 = pdVar2[uVar6 * 2 + 1];
    dVar8 = dVar7;
    if (dVar1 <= dVar7) {
      dVar8 = dVar7 - dVar1;
    }
    lVar5 = uVar6 * 2;
    bVar4 = dVar7 < dVar1;
    uVar6 = uVar6 * 2 + 2;
    dVar7 = dVar8;
    if (bVar4) {
      uVar6 = lVar5 + 1;
    }
  }
  return (int)uVar6 - (int)uVar3;
}

Assistant:

int operator()(R &r) {
      if (P.N_ == 0)
        return -1;
      double u(utility::uniformco<double>(r) * P.P_[0]);
      param_type::size_type x{0};
      while (x < P.offset_) {
        if (u < P.P_[2 * x + 1]) {
          x = 2 * x + 1;
        } else {
          u -= P.P_[2 * x + 1];
          x = 2 * x + 2;
        }
      }
      return static_cast<int>(x - P.offset_);
    }